

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Image::displayImage(Image *this)

{
  _InputArray local_60;
  allocator local_31;
  string local_30 [8];
  string window_name;
  Image *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"GNG",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cv::namedWindow(local_30,0);
  cv::_InputArray::_InputArray(&local_60,&this->content);
  cv::imshow(local_30,&local_60);
  cv::_InputArray::~_InputArray(&local_60);
  cv::waitKey(0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Image::displayImage() {
    std::string window_name = "GNG";
    cv::namedWindow(window_name, cv::WINDOW_NORMAL);
    cv::imshow(window_name, content);
    cv::waitKey(0);
}